

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall
libtorrent::link::unlink<libtorrent::torrent>
          (link *this,vector<libtorrent::torrent_*> *list,torrent_list_index_t link_index)

{
  int iVar1;
  value_type ptVar2;
  size_type sVar3;
  value_type *pptVar4;
  value_type *pvVar5;
  int idx;
  int last;
  vector<libtorrent::torrent_*> *list_local;
  link *this_local;
  torrent_list_index_t link_index_local;
  
  if (this->index != -1) {
    sVar3 = std::vector<libtorrent::torrent_*,_std::allocator<libtorrent::torrent_*>_>::size
                      (&list->
                        super_vector<libtorrent::torrent_*,_std::allocator<libtorrent::torrent_*>_>)
    ;
    idx = (int)sVar3 + -1;
    if (this->index < idx) {
      iVar1 = this->index;
      pptVar4 = libtorrent::aux::
                container_wrapper<libtorrent::torrent_*,_int,_std::vector<libtorrent::torrent_*,_std::allocator<libtorrent::torrent_*>_>_>
                ::operator[](list,idx);
      pvVar5 = libtorrent::aux::
               container_wrapper<libtorrent::link,_libtorrent::aux::strong_typedef<int,_libtorrent::torrent_list_tag,_void>,_std::array<libtorrent::link,_8UL>_>
               ::operator[](&(*pptVar4)->m_links,
                            (strong_typedef<int,_libtorrent::torrent_list_tag,_void>)
                            link_index.m_val);
      pvVar5->index = iVar1;
      pptVar4 = libtorrent::aux::
                container_wrapper<libtorrent::torrent_*,_int,_std::vector<libtorrent::torrent_*,_std::allocator<libtorrent::torrent_*>_>_>
                ::operator[](list,idx);
      ptVar2 = *pptVar4;
      pptVar4 = libtorrent::aux::
                container_wrapper<libtorrent::torrent_*,_int,_std::vector<libtorrent::torrent_*,_std::allocator<libtorrent::torrent_*>_>_>
                ::operator[](list,this->index);
      *pptVar4 = ptVar2;
    }
    libtorrent::aux::
    container_wrapper<libtorrent::torrent*,int,std::vector<libtorrent::torrent*,std::allocator<libtorrent::torrent*>>>
    ::resize<int,void>((container_wrapper<libtorrent::torrent*,int,std::vector<libtorrent::torrent*,std::allocator<libtorrent::torrent*>>>
                        *)list,idx);
    this->index = -1;
  }
  return;
}

Assistant:

void unlink(aux::vector<T*>& list
			, torrent_list_index_t const link_index)
		{
			if (index == -1) return;
			TORRENT_ASSERT(index >= 0 && index < int(list.size()));
			int const last = int(list.size()) - 1;
			if (index < last)
			{
				list[last]->m_links[link_index].index = index;
				list[index] = list[last];
			}
			list.resize(last);
			index = -1;
		}